

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qipaddress.cpp
# Opt level: O2

void QIPAddressUtils::toString(QString *appendTo,IPv4Address address)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_260;
  QArrayDataPointer<char16_t> local_248;
  QArrayDataPointer<char16_t> local_230;
  QArrayDataPointer<char16_t> local_218;
  QStringBuilder<QString,_char16_t> local_1f8;
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> local_1d0;
  QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>,_char16_t> local_198;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>,_char16_t>,_QString>
  local_158;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>,_char16_t>,_QString>,_char16_t>
  local_100;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>,_char16_t>,_QString>,_char16_t>,_QString>
  local_a0;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  number((QString *)&local_218,(quint8)(address >> 0x18));
  local_1f8.a.d.size = local_218.size;
  local_1f8.a.d.ptr = local_218.ptr;
  local_1f8.a.d.d = local_218.d;
  local_218.d = (Data *)0x0;
  local_218.ptr = (char16_t *)0x0;
  local_218.size = 0;
  local_1f8.b = L'.';
  number((QString *)&local_230,(quint8)(address >> 0x10));
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::QStringBuilder
            (&local_1d0,&local_1f8,(QString *)&local_230);
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::QStringBuilder
            (&local_198.a,&local_1d0);
  local_198.b = L'.';
  number((QString *)&local_248,(quint8)(address >> 8));
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>,_char16_t>,_QString>
  ::QStringBuilder(&local_158,&local_198,(QString *)&local_248);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>,_char16_t>,_QString>
  ::QStringBuilder(&local_100.a,&local_158);
  local_100.b = L'.';
  number((QString *)&local_260,(quint8)address);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>,_char16_t>,_QString>,_char16_t>,_QString>
  ::QStringBuilder(&local_a0,&local_100,(QString *)&local_260);
  ::operator+=(appendTo,&local_a0);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>,_char16_t>,_QString>,_char16_t>,_QString>
  ::~QStringBuilder(&local_a0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_260);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>,_char16_t>,_QString>
  ::~QStringBuilder(&local_100.a);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>,_char16_t>,_QString>
  ::~QStringBuilder(&local_158);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_248);
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::~QStringBuilder(&local_198.a);
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::~QStringBuilder(&local_1d0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_230);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1f8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_218);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void toString(QString &appendTo, IPv4Address address)
{
    // reconstructing is easy
    // use the fast operator% that pre-calculates the size
    appendTo += number(address >> 24) % u'.'
                % number(address >> 16) % u'.'
                % number(address >> 8) % u'.'
                % number(address);
}